

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

string * __thiscall svg::Stroke::toString_abi_cxx11_(Stroke *this,Layout *layout)

{
  ostream *poVar1;
  Layout *in_RDX;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  double local_200;
  allocator local_1e1;
  string local_1e0 [8];
  string *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  Layout *in_stack_fffffffffffffe40;
  Color *in_stack_fffffffffffffe48;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  Layout *local_18;
  
  if (0.0 < *(double *)(in_RSI + 8) || *(double *)(in_RSI + 8) == 0.0) {
    local_18 = in_RDX;
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"stroke-width",&local_1e1);
    local_200 = translateScale(*(double *)(in_RSI + 8),local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"",&local_221);
    attribute<double>(in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28);
    poVar1 = std::operator<<(local_190,(string *)&stack0xfffffffffffffe40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"stroke",&local_269);
    Color::toString_abi_cxx11_(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"",&local_2b1);
    attribute<std::__cxx11::string>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::operator<<(poVar1,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    if ((*(byte *)(in_RSI + 0x28) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"vector-effect",&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"",&local_321);
      attribute<char[19]>(in_stack_fffffffffffffe38,(char (*) [19])in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe28);
      std::operator<<(local_190,local_2d8);
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            // If stroke width is invalid.
            if (width < 0)
                return std::string();

            std::stringstream ss;
            ss << attribute("stroke-width", translateScale(width, layout)) << attribute("stroke", color.toString(layout));
            if (nonScaling)
               ss << attribute("vector-effect", "non-scaling-stroke");
            return ss.str();
        }